

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

IVideoDriver * irr::video::createNullDriver(IFileSystem *io,dimension2d<unsigned_int> *screenSize)

{
  IMaterialRenderer *pIVar1;
  IReferenceCounted *this;
  IMaterialRenderer *imr;
  u32 i;
  CNullDriver *nullDriver;
  dimension2d<unsigned_int> *in_stack_00000070;
  IFileSystem *in_stack_00000078;
  CNullDriver *in_stack_00000080;
  IMaterialRenderer *this_00;
  uint local_1c;
  
  pIVar1 = (IMaterialRenderer *)operator_new(0x4a8);
  CNullDriver::CNullDriver(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  local_1c = 0;
  this_00 = pIVar1;
  while (*(long *)(sBuiltInMaterialTypeNames + (ulong)local_1c * 8) != 0) {
    this = (IReferenceCounted *)operator_new(0x20);
    memset(this,0,0x20);
    IMaterialRenderer::IMaterialRenderer(this_00);
    (*pIVar1->_vptr_IMaterialRenderer[0x4d])(pIVar1,this,0);
    IReferenceCounted::drop(this);
    local_1c = local_1c + 1;
  }
  return (IVideoDriver *)pIVar1;
}

Assistant:

IVideoDriver *createNullDriver(io::IFileSystem *io, const core::dimension2d<u32> &screenSize)
{
	CNullDriver *nullDriver = new CNullDriver(io, screenSize);

	// create empty material renderers
	for (u32 i = 0; sBuiltInMaterialTypeNames[i]; ++i) {
		IMaterialRenderer *imr = new IMaterialRenderer();
		nullDriver->addMaterialRenderer(imr);
		imr->drop();
	}

	return nullDriver;
}